

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O2

float __thiscall CTextRender::TextWidth(CTextRender *this,float FontSize,char *pText,int Length)

{
  int iVar1;
  
  if (TextWidth(float,char_const*,int)::s_Cursor == '\0') {
    iVar1 = __cxa_guard_acquire(&TextWidth(float,char_const*,int)::s_Cursor);
    if (iVar1 != 0) {
      CTextCursor::CTextCursor(&TextWidth::s_Cursor);
      __cxa_atexit(CTextCursor::~CTextCursor,&TextWidth::s_Cursor,&__dso_handle);
      __cxa_guard_release(&TextWidth(float,char_const*,int)::s_Cursor);
    }
  }
  TextWidth::s_Cursor.m_Flags = 1;
  TextWidth::s_Cursor.m_FontSize = FontSize;
  CTextCursor::Reset(&TextWidth::s_Cursor,-1);
  (*(this->super_IEngineTextRender).super_ITextRender.super_IInterface._vptr_IInterface[7])
            (this,&TextWidth::s_Cursor,pText,(ulong)(uint)Length);
  return TextWidth::s_Cursor.m_Width;
}

Assistant:

float CTextRender::TextWidth(float FontSize, const char *pText, int Length)
{
	static CTextCursor s_Cursor;
	s_Cursor.m_FontSize = FontSize;
	s_Cursor.m_Flags = TEXTFLAG_NO_RENDER;
	s_Cursor.Reset();
	TextDeferred(&s_Cursor, pText, Length);
	return s_Cursor.m_Width;
}